

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLinOp::define
          (MLNodeLinOp *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          LPInfo *a_info,
          Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          *a_factory,int a_eb_limit_coarsening)

{
  bool bVar1;
  int *piVar2;
  FabArrayBase *this_00;
  BoxArray *pBVar3;
  BoxArray *pBVar4;
  long in_RDI;
  int in_stack_00000008;
  int amrlev_2;
  int amrlev_1;
  int mglev;
  int amrlev;
  bool eb_limit_coarsening;
  uint uVar5;
  value_type in_stack_fffffffffffffa0c;
  FabArray<amrex::IArrayBox> *in_stack_fffffffffffffa10;
  iMultiFab *__args;
  IntVect *in_stack_fffffffffffffa20;
  BoxArray *in_stack_fffffffffffffa28;
  vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  *in_stack_fffffffffffffa30;
  BoxArray *in_stack_fffffffffffffa38;
  Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
  *in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  int iVar6;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  *in_stack_fffffffffffffa50;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_fffffffffffffa58;
  IntVect *this_01;
  BoxArray *in_stack_fffffffffffffa60;
  MLLinOp *in_stack_fffffffffffffa68;
  MFInfo *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa7c;
  BoxArray *in_stack_fffffffffffffa90;
  int *in_stack_fffffffffffffaa0;
  int *__args_3;
  int *in_stack_fffffffffffffaa8;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_fffffffffffffab0;
  BoxArray *in_stack_fffffffffffffab8;
  IntVect local_4dc [10];
  BoxArray local_464;
  pointer in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc34;
  char *in_stack_fffffffffffffc38;
  MultiArray4<int> in_stack_fffffffffffffc40;
  Geometry *in_stack_fffffffffffffcc8;
  DistributionMapping *in_stack_fffffffffffffcd0;
  BoxArray *in_stack_fffffffffffffcd8;
  int local_264;
  MFInfo local_258;
  undefined4 local_230;
  undefined4 local_22c;
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_210;
  undefined4 local_20c;
  int local_208 [2];
  int local_200;
  int local_1f8 [2];
  int local_1f0;
  int local_1e8 [29];
  int local_174;
  int local_164;
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 local_138;
  undefined4 local_134;
  int local_130 [2];
  int local_128;
  int local_120 [2];
  int local_118;
  int local_9c;
  int local_98;
  bool local_91;
  int local_60 [2];
  int local_58;
  IntVect local_4c;
  int local_40 [2];
  int local_38;
  IntVect local_2c;
  char *local_20;
  undefined4 local_14;
  char *local_10;
  char *local_8;
  
  local_91 = 0 < in_stack_00000008;
  uVar5 = (uint)local_91;
  MLLinOp::define(in_stack_fffffffffffffa68,
                  (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                  in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                  (LPInfo *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                  in_stack_fffffffffffffa40,SUB81((ulong)in_stack_fffffffffffffa38 >> 0x38,0));
  bVar1 = MLLinOp::hasHiddenDimension((MLLinOp *)0x1680e87);
  if (bVar1) {
    local_8 = "!hasHiddenDimension()";
    local_10 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLinOp.cpp"
    ;
    local_14 = 0x2a;
    local_20 = "\"Nodal solver cannot have any hidden dimensions\"";
    Assert_host((char *)in_stack_fffffffffffffc40.hp,in_stack_fffffffffffffc38,
                in_stack_fffffffffffffc34,(char *)in_stack_fffffffffffffc28);
  }
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::resize(in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28);
  for (local_98 = 0; local_98 < *(int *)(in_RDI + 0x34); local_98 = local_98 + 1) {
    Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                  *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10,
               CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    std::
    vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ::resize((vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
              *)in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28);
    for (local_9c = 0; iVar6 = local_9c,
        piVar2 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10,
                            CONCAT44(in_stack_fffffffffffffa0c,uVar5)), iVar6 < *piVar2;
        local_9c = local_9c + 1) {
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      IntVect::IntVect(&local_2c,1);
      local_38 = local_2c.vect[2];
      local_40[0] = local_2c.vect[0];
      local_40[1] = local_2c.vect[1];
      local_128 = local_2c.vect[2];
      local_130[0] = local_2c.vect[0];
      local_130[1] = local_2c.vect[1];
      local_118 = local_2c.vect[2];
      local_120[0] = local_2c.vect[0];
      local_120[1] = local_2c.vect[1];
      convert(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
      Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
                 in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      local_134 = 1;
      local_138 = 0;
      std::make_unique<amrex::iMultiFab,amrex::BoxArray,amrex::DistributionMapping&,int,int>
                (in_stack_fffffffffffffab8,(DistributionMapping *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
      Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator=
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                 in_stack_fffffffffffffa10,
                 (unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                 CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::~unique_ptr
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                 in_stack_fffffffffffffa20);
      BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffa10);
      Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator->
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)0x1681173);
      FabArray<amrex::IArrayBox>::setVal<amrex::IArrayBox,_0>
                (in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c);
    }
  }
  Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_stack_fffffffffffffa10,
             CONCAT44(in_stack_fffffffffffffa0c,uVar5));
  Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
            ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)in_stack_fffffffffffffa10,
             CONCAT44(in_stack_fffffffffffffa0c,uVar5));
  makeOwnerMask(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator=
            ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
             in_stack_fffffffffffffa10,
             (unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
             CONCAT44(in_stack_fffffffffffffa0c,uVar5));
  std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::~unique_ptr
            ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
             in_stack_fffffffffffffa20);
  piVar2 = Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10,
                      CONCAT44(in_stack_fffffffffffffa0c,uVar5));
  if (*piVar2 == 1) {
    std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator*
              ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
               in_stack_fffffffffffffa10);
    local_15c = 0;
    local_160 = 0;
    this_00 = (FabArrayBase *)
              std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator->
                        ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                         0x16812fa);
    local_164 = FabArrayBase::nComp(this_00);
    std::make_unique<amrex::iMultiFab,amrex::iMultiFab&,amrex::MakeType,int,int>
              ((iMultiFab *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
               (MakeType *)in_stack_fffffffffffffa40,(int *)in_stack_fffffffffffffa38,
               (int *)in_stack_fffffffffffffa30);
    std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator=
              ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
               in_stack_fffffffffffffa10,
               (unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
               CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
               in_stack_fffffffffffffa20);
  }
  else {
    in_stack_fffffffffffffab0 =
         Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
         ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                       *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10,
               CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    in_stack_fffffffffffffab8 =
         (BoxArray *)
         Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
         ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                       *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10,
               CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10,
               CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    makeOwnerMask(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator=
              ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
               in_stack_fffffffffffffa10,
               (unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
               CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
               in_stack_fffffffffffffa20);
  }
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
            *)in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28);
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
            *)in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28);
  std::
  vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
            *)in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28);
  for (local_174 = 0; local_174 < *(int *)(in_RDI + 0x34); local_174 = local_174 + 1) {
    if (local_174 < *(int *)(in_RDI + 0x34) + -1) {
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      __args_3 = (int *)0x0;
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      IntVect::IntVect(&local_4c,1);
      local_58 = local_4c.vect[2];
      local_60[0] = local_4c.vect[0];
      local_60[1] = local_4c.vect[1];
      local_200 = local_4c.vect[2];
      local_208[0] = local_4c.vect[0];
      local_208[1] = local_4c.vect[1];
      local_1f0 = local_4c.vect[2];
      local_1f8[0] = local_4c.vect[0];
      local_1f8[1] = local_4c.vect[1];
      piVar2 = local_1e8;
      convert(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
      Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
                 in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      local_20c = 1;
      local_210 = 0;
      std::make_unique<amrex::iMultiFab,amrex::BoxArray,amrex::DistributionMapping&,int,int>
                (in_stack_fffffffffffffab8,(DistributionMapping *)in_stack_fffffffffffffab0,piVar2,
                 __args_3);
      Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator=
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                 in_stack_fffffffffffffa10,
                 (unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                 CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::~unique_ptr
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                 in_stack_fffffffffffffa20);
      BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffa10);
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      in_stack_fffffffffffffa90 =
           Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                     ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                      in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
                 in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      local_21c = 1;
      local_220 = 1;
      std::make_unique<amrex::iMultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int,int>
                (in_stack_fffffffffffffab8,(DistributionMapping *)in_stack_fffffffffffffab0,piVar2,
                 __args_3);
      Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator=
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                 in_stack_fffffffffffffa10,
                 (unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                 CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::~unique_ptr
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                 in_stack_fffffffffffffa20);
    }
    else {
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      in_stack_fffffffffffffa7c = 0;
      in_stack_fffffffffffffa68 = (MLLinOp *)0x0;
      pBVar3 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                         ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                          in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      pBVar4 = (BoxArray *)
               Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
               operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                           *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      local_22c = 1;
      local_230 = 1;
      local_258.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_258.alloc = false;
      local_258._1_7_ = 0;
      local_258.arena = (Arena *)0x0;
      local_258.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      in_stack_fffffffffffffa70 = &local_258;
      MFInfo::MFInfo((MFInfo *)0x168184f);
      MFInfo::SetAlloc(in_stack_fffffffffffffa70,SUB41(in_stack_fffffffffffffa7c,0));
      std::
      make_unique<amrex::iMultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int,int,amrex::MFInfo&>
                (pBVar4,(DistributionMapping *)pBVar3,
                 (int *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 (int *)in_stack_fffffffffffffa70,(MFInfo *)in_stack_fffffffffffffa68);
      Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator=
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                 in_stack_fffffffffffffa10,
                 (unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                 CONCAT44(in_stack_fffffffffffffa0c,uVar5));
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::~unique_ptr
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                 in_stack_fffffffffffffa20);
      MFInfo::~MFInfo((MFInfo *)0x16818d2);
    }
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    in_stack_fffffffffffffa60 =
         Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                   ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                    in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    std::make_unique<amrex::LayoutData<int>,amrex::BoxArray&,amrex::DistributionMapping&>
              (in_stack_fffffffffffffa38,(DistributionMapping *)in_stack_fffffffffffffa30);
    Vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
                  *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>::
    operator=((unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_> *)
              in_stack_fffffffffffffa10,
              (unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_> *)
              CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>::
    ~unique_ptr((unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_> *
                )in_stack_fffffffffffffa10);
  }
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
            *)in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28);
  for (local_264 = 0; local_264 < *(int *)(in_RDI + 0x34) + -1; local_264 = local_264 + 1) {
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    pBVar4 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                       ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                        in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    pBVar3 = &local_464;
    iVar6 = 1;
    IntVect::IntVect((IntVect *)pBVar3,1);
    convert(pBVar3,(IntVect *)pBVar4);
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    this_01 = local_4dc;
    IntVect::IntVect(this_01,iVar6);
    iVar6 = (int)((ulong)this_01 >> 0x20);
    convert(pBVar3,(IntVect *)pBVar4);
    piVar2 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10,
                        CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    __args = (iMultiFab *)&stack0xfffffffffffffb18;
    IntVect::IntVect((IntVect *)__args,*piVar2);
    uVar5 = 0;
    makeFineMask((BoxArray *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 (DistributionMapping *)in_stack_fffffffffffffa70,
                 (BoxArray *)in_stack_fffffffffffffa68,(IntVect *)in_stack_fffffffffffffa60,iVar6,
                 (int)in_stack_fffffffffffffa90);
    std::make_unique<amrex::iMultiFab,amrex::iMultiFab>(__args);
    Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  *)in_stack_fffffffffffffa10,CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator=
              ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
               in_stack_fffffffffffffa10,
               (unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
               CONCAT44(in_stack_fffffffffffffa0c,uVar5));
    std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)pBVar4);
    iMultiFab::~iMultiFab((iMultiFab *)0x1681bab);
    BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffa10);
    BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffa10);
  }
  return;
}

Assistant:

void
MLNodeLinOp::define (const Vector<Geometry>& a_geom,
                     const Vector<BoxArray>& a_grids,
                     const Vector<DistributionMapping>& a_dmap,
                     const LPInfo& a_info,
                     const Vector<FabFactory<FArrayBox> const*>& a_factory,
                     int a_eb_limit_coarsening)
{
    bool eb_limit_coarsening;
    if (a_eb_limit_coarsening < 0) { // default
#if defined(AMREX_USE_HYPRE) && (AMREX_SPACEDIM > 1)
        eb_limit_coarsening = true;
#else
        eb_limit_coarsening = false;
#endif
    } else {
        eb_limit_coarsening = a_eb_limit_coarsening;
    }

    MLLinOp::define(a_geom, a_grids, a_dmap, a_info, a_factory, eb_limit_coarsening);

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(!hasHiddenDimension(),
                                     "Nodal solver cannot have any hidden dimensions");

    m_dirichlet_mask.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        m_dirichlet_mask[amrlev].resize(m_num_mg_levels[amrlev]);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            m_dirichlet_mask[amrlev][mglev] = std::make_unique<iMultiFab>
                (amrex::convert(m_grids[amrlev][mglev],IntVect::TheNodeVector()),
                 m_dmap[amrlev][mglev], 1, 0);
            m_dirichlet_mask[amrlev][mglev]->setVal(0); // non-Dirichlet by default
        }
    }

    m_owner_mask_top = makeOwnerMask(m_grids[0][0],
                                      m_dmap[0][0],
                                      m_geom[0][0]);
    if (m_num_mg_levels[0] == 1) {
        m_owner_mask_bottom = std::make_unique<iMultiFab>(*m_owner_mask_top, amrex::make_alias, 0,
                                                          m_owner_mask_top->nComp());
    } else {
        m_owner_mask_bottom = makeOwnerMask(m_grids[0][m_num_mg_levels[0]-1],
                                             m_dmap[0][m_num_mg_levels[0]-1],
                                             m_geom[0][m_num_mg_levels[0]-1]);
    }

    m_cc_fine_mask.resize(m_num_amr_levels);
    m_nd_fine_mask.resize(m_num_amr_levels);
    m_has_fine_bndry.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        if (amrlev < m_num_amr_levels-1)
        {
            m_nd_fine_mask[amrlev] = std::make_unique<iMultiFab>
                (amrex::convert(m_grids[amrlev][0],IntVect::TheNodeVector()),
                 m_dmap[amrlev][0], 1, 0);
            m_cc_fine_mask[amrlev] = std::make_unique<iMultiFab>
                (m_grids[amrlev][0], m_dmap[amrlev][0], 1, 1);
        } else {
            m_cc_fine_mask[amrlev] = std::make_unique<iMultiFab>
                (m_grids[amrlev][0], m_dmap[amrlev][0], 1, 1, MFInfo().SetAlloc(false));
        }
        m_has_fine_bndry[amrlev] = std::make_unique<LayoutData<int> >(m_grids[amrlev][0],
                                                                      m_dmap[amrlev][0]);
    }

    m_norm_fine_mask.resize(m_num_amr_levels-1);
    for (int amrlev = 0; amrlev < m_num_amr_levels-1; ++amrlev) {
        m_norm_fine_mask[amrlev] = std::make_unique<iMultiFab>
            (makeFineMask(amrex::convert(m_grids[amrlev][0], IntVect(1)), m_dmap[amrlev][0],
                          amrex::convert(m_grids[amrlev+1][0], IntVect(1)),
                          IntVect(m_amr_ref_ratio[amrlev]), 1, 0));
    }
}